

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::convert_to_onelearner_actions
               (search *sch,v_array<unsigned_int> *actions,v_array<unsigned_int> *actions_onelearner
               ,uint32_t left_label,uint32_t right_label)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  undefined8 in_RAX;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t i;
  uint32_t i_1;
  undefined8 uStack_38;
  
  pvVar2 = sch->task_data;
  uStack_38 = in_RAX;
  v_array<unsigned_int>::clear(actions_onelearner);
  puVar4 = actions->_begin;
  puVar5 = actions->_end;
  uVar6 = (long)puVar5 - (long)puVar4 >> 2;
  uVar7 = 0xffffffffffffffff;
  do {
    if (uVar7 - uVar6 == -1) goto LAB_0023179c;
    uVar1 = uVar7 + 1;
    lVar3 = uVar7 + 1;
    uVar7 = uVar1;
  } while (puVar4[lVar3] != 1);
  if (uVar1 < uVar6) {
    v_array<unsigned_int>::push_back(actions_onelearner,&SHIFT);
    puVar4 = actions->_begin;
    puVar5 = actions->_end;
  }
LAB_0023179c:
  if (*(int *)((long)pvVar2 + 0x2c4) == 2) {
    uVar6 = (long)puVar5 - (long)puVar4 >> 2;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 - uVar6 == -1) goto LAB_002317f9;
      uVar1 = uVar7 + 1;
      lVar3 = uVar7 + 1;
      uVar7 = uVar1;
    } while (puVar4[lVar3] != 4);
    if (uVar1 < uVar6) {
      uStack_38 = CONCAT44(*(int *)((long)pvVar2 + 0x10) * 2 + 2,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
      puVar4 = actions->_begin;
      puVar5 = actions->_end;
    }
  }
LAB_002317f9:
  uVar7 = (long)puVar5 - (long)puVar4 >> 2;
  if (left_label == 9999999) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 - uVar7 == -1) goto LAB_0023190a;
      uVar1 = uVar6 + 1;
      lVar3 = uVar6 + 1;
      uVar6 = uVar1;
    } while (puVar4[lVar3] != 2);
    if (uVar1 < uVar7) {
      for (uVar7 = 0; uVar7 < *(uint *)((long)pvVar2 + 0x10); uVar7 = uVar7 + 1) {
        if (uVar7 != *(long *)((long)pvVar2 + 8) - 1U) {
          uStack_38 = CONCAT44((int)uVar7 + 2,(undefined4)uStack_38);
          v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
        }
      }
      puVar4 = actions->_begin;
      puVar5 = actions->_end;
    }
LAB_0023190a:
    uVar6 = (long)puVar5 - (long)puVar4 >> 2;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 - uVar6 == -1) {
        return;
      }
      uVar1 = uVar7 + 1;
      lVar3 = uVar7 + 1;
      uVar7 = uVar1;
    } while (puVar4[lVar3] != 3);
    if (uVar1 < uVar6) {
      for (uVar7 = 0; uVar7 < *(uint *)((long)pvVar2 + 0x10); uVar7 = uVar7 + 1) {
        if ((*(int *)((long)pvVar2 + 0x2c4) == 2) || (uVar7 != *(long *)((long)pvVar2 + 8) - 1U)) {
          uStack_38 = CONCAT44(*(uint *)((long)pvVar2 + 0x10) + (int)uVar7 + 2,(undefined4)uStack_38
                              );
          v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
        }
      }
    }
  }
  else {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 - uVar7 == -1) goto LAB_002318ba;
      uVar1 = uVar6 + 1;
      lVar3 = uVar6 + 1;
      uVar6 = uVar1;
    } while (puVar4[lVar3] != 2);
    if (uVar1 < uVar7) {
      uStack_38 = CONCAT44(right_label + 1,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
      puVar4 = actions->_begin;
      uVar7 = (long)actions->_end - (long)puVar4 >> 2;
    }
LAB_002318ba:
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 - uVar7 == -1) {
        return;
      }
      uVar1 = uVar6 + 1;
      lVar3 = uVar6 + 1;
      uVar6 = uVar1;
    } while (puVar4[lVar3] != 3);
    if (uVar1 < uVar7) {
      uStack_38 = CONCAT44(*(int *)((long)pvVar2 + 0x10) + left_label + 1,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
    }
  }
  return;
}

Assistant:

void convert_to_onelearner_actions(Search::search &sch, v_array<action> &actions, v_array<action> &actions_onelearner,
    uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  uint32_t &num_label = data->num_label;
  actions_onelearner.clear();
  if (is_valid(SHIFT, actions))
    actions_onelearner.push_back(SHIFT);
  if (sys == arc_eager && is_valid(REDUCE, actions))
    actions_onelearner.push_back(2 + 2 * num_label);
  if (left_label != my_null && is_valid(REDUCE_RIGHT, actions))
    actions_onelearner.push_back(1 + right_label);
  if (left_label != my_null && is_valid(REDUCE_LEFT, actions))
    actions_onelearner.push_back(1 + left_label + num_label);
  if (left_label == my_null && is_valid(REDUCE_RIGHT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (i != data->root_label - 1)
        actions_onelearner.push_back(i + 2);
  if (left_label == my_null && is_valid(REDUCE_LEFT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (sys == arc_eager || i != data->root_label - 1)
        actions_onelearner.push_back((uint32_t)(i + 2 + num_label));
}